

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

segment_t *
kiste::parse_expression(segment_t *__return_storage_ptr__,string *line,segment_type type,size_t pos)

{
  char *pcVar1;
  parse_error *this;
  char cVar2;
  int iVar3;
  string expression;
  
  expression._M_dataplus._M_p = (pointer)&expression.field_2;
  expression._M_string_length = 0;
  expression.field_2._M_local_buf[0] = '\0';
  iVar3 = 1;
  while ((pos < line->_M_string_length && (iVar3 != 0))) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)line);
    cVar2 = (char)&expression;
    if (*pcVar1 == '{') {
      std::__cxx11::string::at((ulong)line);
      std::__cxx11::string::push_back(cVar2);
      iVar3 = iVar3 + 1;
    }
    else if (*pcVar1 == '}') {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        std::__cxx11::string::at((ulong)line);
        std::__cxx11::string::push_back(cVar2);
      }
    }
    else {
      std::__cxx11::string::at((ulong)line);
      std::__cxx11::string::push_back(cVar2);
    }
    pos = pos + 1;
  }
  if (iVar3 < 1) {
    __return_storage_ptr__->_end_pos = pos - 1;
    __return_storage_ptr__->_type = type;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->_text,(string *)&expression);
    std::__cxx11::string::~string((string *)&expression);
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(this,"missing closing brace");
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_expression(const std::string& line, segment_type type, std::size_t pos) -> segment_t
  {
    auto expression = std::string{};
    auto arg_curly_level = 1;

    for (; pos < line.size() and arg_curly_level; ++pos)
    {
      switch (line.at(pos))
      {
      case '{':
        ++arg_curly_level;
        expression.push_back(line.at(pos));
        break;
      case '}':
        --arg_curly_level;
        if (arg_curly_level)
        {
          expression.push_back(line.at(pos));
        }
        else
        {
          // do nothing, as this probably the closing curly brace of the command
        }
        break;
      default:
        expression.push_back(line.at(pos));
      }
    }
    if (arg_curly_level > 0)
    {
      throw parse_error("missing closing brace");
    }
    --pos;

    return {pos, type, expression};
  }